

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

int history_def_prev(void *p,HistEvent *ev)

{
  undefined8 *puVar1;
  int iVar2;
  history_t *h;
  HistEvent *ev_local;
  void *p_local;
  
  if (*(void **)((long)p + 0x28) == p) {
    iVar2 = 5;
    if (0 < *(int *)((long)p + 0x34)) {
      iVar2 = 6;
    }
    ev->num = iVar2;
    iVar2 = 5;
    if (0 < *(int *)((long)p + 0x34)) {
      iVar2 = 6;
    }
    ev->str = he_errlist[iVar2];
    p_local._4_4_ = -1;
  }
  else if (*(void **)(*(long *)((long)p + 0x28) + 0x20) == p) {
    ev->num = 7;
    ev->str = "no previous event";
    p_local._4_4_ = -1;
  }
  else {
    *(undefined8 *)((long)p + 0x28) = *(undefined8 *)(*(long *)((long)p + 0x28) + 0x20);
    puVar1 = *(undefined8 **)((long)p + 0x28);
    *(undefined8 *)ev = *puVar1;
    ev->str = (char *)puVar1[1];
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int
history_def_prev(void *p, TYPE(HistEvent) *ev)
{
	history_t *h = (history_t *) p;

	if (h->cursor == &h->list) {
		he_seterrev(ev,
		    (h->cur > 0) ? _HE_END_REACHED : _HE_EMPTY_LIST);
		return -1;
	}

	if (h->cursor->prev == &h->list) {
		he_seterrev(ev, _HE_START_REACHED);
		return -1;
	}

        h->cursor = h->cursor->prev;
        *ev = h->cursor->ev;

	return 0;
}